

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O1

void __thiscall cppnet::BufferQueue::Append(BufferQueue *this)

{
  shared_ptr<cppnet::BufferBlock> temp;
  AlloterWrap local_28;
  shared_ptr<cppnet::BufferBlock> local_18;
  
  AlloterWrap::PoolNewSharePtr<cppnet::BufferBlock,std::shared_ptr<cppnet::BlockMemoryPool>&>
            (&local_28,
             (shared_ptr<cppnet::BlockMemoryPool> *)
             (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if ((this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)
           local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->_buffer_write).
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  local_18.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_18.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if (local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  List<cppnet::BufferBlock>::PushBack(&this->_buffer_list,&local_18);
  if (local_18.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28._alloter.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void BufferQueue::Append() {
    auto temp = _alloter->PoolNewSharePtr<BufferBlock>(_block_alloter);

    if (!_buffer_write) {
        _buffer_write = temp;
    }
    
    _buffer_list.PushBack(temp);
}